

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem1.cpp
# Opt level: O1

bool isPowerOfTwo(longlong x)

{
  double dVar1;
  double dVar2;
  
  if (x != 0) {
    dVar1 = log2((double)x);
    dVar1 = ceil(dVar1);
    dVar2 = log2((double)x);
    dVar2 = floor(dVar2);
    return (bool)(-(dVar2 == dVar1) & 1);
  }
  return false;
}

Assistant:

bool isPowerOfTwo(ll x){ if(x==0) return false; return (ceil(log2(x)) == floor(log2(x))); }